

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O2

Error __thiscall asmjit::BaseRAPass::addExitBlock(BaseRAPass *this,RABlock *block)

{
  Error EVar1;
  RABlock *local_8;
  
  *(byte *)&block->_flags = (byte)block->_flags | 0x10;
  local_8 = block;
  EVar1 = ZoneVector<asmjit::RABlock_*>::append(&this->_exits,&this->_allocator,&local_8);
  return EVar1;
}

Assistant:

inline Error addExitBlock(RABlock* block) noexcept {
    block->addFlags(RABlock::kFlagIsFuncExit);
    return _exits.append(allocator(), block);
  }